

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O2

void __thiscall MyCompiler::Term::Term(Term *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Term",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->vMulDivOpFactor).
  super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vMulDivOpFactor).
  super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vMulDivOpFactor).
  super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MyCompiler::Term::Term()
        : AbstractAstNode("Term")
{}